

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O2

int __thiscall libnbt::NBTTagVector<long>::remove(NBTTagVector<long> *this,char *__filename)

{
  iterator iVar1;
  char *pcVar2;
  
  iVar1._M_current =
       (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
       ._M_start;
  pcVar2 = (char *)((long)(this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)iVar1._M_current >> 3);
  if (__filename < pcVar2) {
    iVar1 = std::vector<long,_std::allocator<long>_>::erase
                      (&this->array,iVar1._M_current + (long)__filename);
  }
  return (int)CONCAT71((int7)((ulong)iVar1._M_current >> 8),__filename < pcVar2);
}

Assistant:

virtual bool remove(size_t index) {
            if (index < array.size()) {
                array.erase(array.begin() + index);
                return true;
            }
            return false;
        }